

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O2

void __thiscall Snake::UpdateHead(Snake *this)

{
  float fVar1;
  __type _Var2;
  
  switch(this->direction) {
  case kUp:
    fVar1 = this->head_y - this->speed;
    break;
  case kDown:
    fVar1 = this->speed + this->head_y;
    break;
  case kLeft:
    fVar1 = this->head_x - this->speed;
    goto LAB_00103948;
  case kRight:
    fVar1 = this->speed + this->head_x;
LAB_00103948:
    this->head_x = fVar1;
  default:
    goto switchD_00103924_default;
  }
  this->head_y = fVar1;
switchD_00103924_default:
  _Var2 = std::fmod<float,int>((float)this->grid_width + this->head_x,this->grid_width);
  this->head_x = (float)_Var2;
  _Var2 = std::fmod<float,int>((float)this->grid_height + this->head_y,this->grid_height);
  this->head_y = (float)_Var2;
  return;
}

Assistant:

void Snake::UpdateHead() {
  switch (direction) {
    case Direction::kUp:
      head_y -= speed;
      break;

    case Direction::kDown:
      head_y += speed;
      break;

    case Direction::kLeft:
      head_x -= speed;
      break;

    case Direction::kRight:
      head_x += speed;
      break;
  }

  // Wrap the Snake around to the beginning if going off of the screen.
  head_x = fmod(head_x + grid_width, grid_width);
  head_y = fmod(head_y + grid_height, grid_height);
}